

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O3

void okim6295_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  DEV_SMPL *pDVar1;
  byte bVar2;
  INT16 IVar3;
  long lVar4;
  oki_adpcm_state *adpcm;
  uint uVar5;
  ulong uVar6;
  
  __n = (ulong)samples * 4;
  lVar4 = 0;
  memset(*outputs,0,__n);
  do {
    if (((*(char *)((long)info + lVar4 * 0x30 + 0x20) != '\0') && (samples != 0)) &&
       (adpcm = (oki_adpcm_state *)((long)info + lVar4 * 0x30 + 8),
       *(char *)((long)&adpcm[1].diff_lookup + 4) == '\0')) {
      pDVar1 = *outputs;
      uVar5 = *(uint *)&adpcm[1].index_shift;
      uVar6 = 0;
      do {
        bVar2 = memory_raw_read_byte
                          ((okim6295_state *)info,(uVar5 >> 1) + *(int *)&adpcm[1].field_0x4);
        IVar3 = oki_adpcm_clock(adpcm,bVar2 >> (~(byte)(uVar5 << 2) & 4));
        pDVar1[uVar6] = pDVar1[uVar6] + ((int)IVar3 * *(int *)&adpcm[1].diff_lookup) / 2;
        uVar5 = *(int *)&adpcm[1].index_shift + 1;
        *(uint *)&adpcm[1].index_shift = uVar5;
        if (*(uint *)((long)&adpcm[1].index_shift + 4) <= uVar5) {
          *(undefined1 *)&adpcm[1].signal = 0;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (samples != uVar6);
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      memcpy(outputs[1],*outputs,__n);
      return;
    }
  } while( true );
}

Assistant:

static void okim6295_update(void* info, UINT32 samples, DEV_SMPL** outputs)
{
	okim6295_state *chip = (okim6295_state *)info;
	int i;

	// reset the output stream
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));

	// iterate over voices and accumulate sample data
	for (i = 0; i < OKIM6295_VOICES; i++)
		generate_adpcm(chip, &chip->voice[i], outputs[0], samples);

	memcpy(outputs[1], outputs[0], samples * sizeof(*outputs[0]));
}